

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool runTest(size_t index,size_t total,char *name,TestFunc *func)

{
  code *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  char *message;
  bool result;
  
  printf("Test %d/%d: %s\n...................................................................\n",
         in_RDI,in_RSI,in_RDX);
  (*in_RCX)();
  printf("\n>>> Passed\n\n");
  return true;
}

Assistant:

bool
runTest(
	size_t index,
	size_t total,
	const char* name,
	TestFunc* func
) {
	printf(
		"Test %d/%d: %s\n"
		"...................................................................\n",
		index,
		total,
		name
	);

	bool result = true;
	try {
		func();
	} catch (const char* message) {
		printf("%s\n", message);
		result = false;
	} catch (...) {
		result = false;
	}

	printf(result ? "\n>>> Passed\n\n" : "\n>>> FAILED\n\n");
	return result;
}